

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacintoshIMG.cpp
# Opt level: O1

shared_ptr<Storage::Disk::Track> __thiscall
Storage::Disk::MacintoshIMG::get_track_at_position(MacintoshIMG *this,Address address)

{
  byte bVar1;
  _Bit_type *p_Var2;
  int iVar3;
  SectorSpan SVar4;
  long lVar5;
  int iVar6;
  undefined8 in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  uint track;
  int iVar7;
  ulong uVar8;
  pthread_mutex_t *__mutex;
  bool side_two;
  shared_ptr<Storage::Disk::Track> sVar9;
  PCMSegment segment;
  uint8_t sector_plus_tags [524];
  PCMSegment PStack_338;
  pthread_mutex_t *local_2e0;
  byte local_2d8 [12];
  uint local_2cc;
  Address local_2c8;
  long local_2c0;
  PCMSegment local_2b8;
  MacintoshIMG *local_260;
  undefined8 local_258;
  long local_250;
  PCMSegment local_248 [6];
  
  __mutex = (pthread_mutex_t *)((long)address + 0x130);
  iVar3 = pthread_mutex_lock(__mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  if (*(uint *)((long)address + 0xf0) < 2) {
    track = (uint)((long)in_RDX >> 0x22);
    SVar4 = Encodings::AppleGCR::Macintosh::sectors_in_track(track);
    iVar3 = SVar4.length;
    lVar5 = (ulong)((int)in_RDX * iVar3 +
                   (((*(byte *)((long)address + 0xf4) >> 5 & 1) != 0) + 1) * SVar4.start) << 0x20;
    uVar8 = lVar5 >> 0x17;
    local_2c0 = *(long *)((long)address + 0xf8);
    if (uVar8 < (ulong)(*(long *)((long)address + 0x100) - local_2c0)) {
      local_250 = *(long *)((long)address + 0x110) + (lVar5 >> 0x20) * 0xc;
      if (*(long *)((long)address + 0x118) == *(long *)((long)address + 0x110)) {
        local_250 = 0;
      }
      local_2b8.length_of_a_bit.length = 1;
      local_2b8.length_of_a_bit.clock_rate = 1;
      local_2b8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_2b8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_offset = 0;
      local_2b8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_2b8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      local_2b8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_2b8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      local_2b8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
      local_2b8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
      local_2b8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_2b8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      local_2e0 = __mutex;
      local_2c8 = address;
      Encodings::AppleGCR::six_and_two_sync(local_248,0x18);
      PCMSegment::operator+=(&local_2b8,local_248);
      if (local_248[0].fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_248[0].fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_248[0].fuzzy_mask.super__Bvector_base<std::allocator<bool>_>.
                              _M_impl.super__Bvector_impl_data._M_end_of_storage -
                        (long)local_248[0].fuzzy_mask.super__Bvector_base<std::allocator<bool>_>.
                              _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                              _M_p);
        local_248[0].fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_248[0].fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
        local_248[0].fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_248[0].fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
        local_248[0].fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
      }
      local_260 = this;
      if ((FILE *)local_248[0].data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (FILE *)0x0) {
        operator_delete(local_248[0].data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_248[0].data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_248[0].data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_248[0].data.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_248[0].data.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
        local_248[0].data.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_248[0].data.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
        local_248[0].data.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
      }
      local_2d8[8] = 0xff;
      local_2d8[9] = 0xff;
      local_2d8[10] = 0xff;
      local_2d8[0xb] = 0xff;
      local_2d8[0] = 0xff;
      local_2d8[1] = 0xff;
      local_2d8[2] = 0xff;
      local_2d8[3] = 0xff;
      local_2d8[4] = 0xff;
      local_2d8[5] = 0xff;
      local_2d8[6] = 0xff;
      local_2d8[7] = 0xff;
      if (iVar3 != 0 && -1 < (long)SVar4) {
        bVar1 = *(byte *)((long)local_2c8 + 0xf4);
        iVar7 = 0;
        iVar6 = 0;
        do {
          for (; local_2d8[iVar6] != 0xff; iVar6 = (iVar6 + 1) % iVar3) {
          }
          local_2d8[iVar6] = (byte)iVar7;
          iVar6 = (int)(iVar6 + (bVar1 & 0x1f)) % iVar3;
          iVar7 = iVar7 + 1;
        } while (iVar7 != iVar3);
      }
      if (iVar3 != 0 && -1 < (long)SVar4) {
        local_2c0 = local_2c0 + uVar8;
        local_2cc = track & 0xff;
        uVar8 = 0;
        local_258 = in_RDX;
        do {
          bVar1 = local_2d8[uVar8];
          if (local_250 == 0) {
            local_248[0].data.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                 (_Bit_type *)
                 ((ulong)local_248[0].data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_ <<
                 0x20);
            local_248[0].length_of_a_bit.length = 0;
            local_248[0].length_of_a_bit.clock_rate = 0;
          }
          else {
            local_248[0].data.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                 (_Bit_type *)
                 CONCAT44(local_248[0].data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,
                          *(undefined4 *)(local_250 + 8 + (ulong)bVar1 * 0xc));
            local_248[0].length_of_a_bit = *(Time *)(local_250 + (ulong)bVar1 * 0xc);
          }
          side_two = (int)local_258 != 0;
          memcpy((void *)((long)&local_248[0].data.super__Bvector_base<std::allocator<bool>_>.
                                 _M_impl.super__Bvector_impl_data._M_start + 4),
                 (void *)((ulong)bVar1 * 0x200 + local_2c0),0x200);
          Encodings::AppleGCR::Macintosh::header
                    (&PStack_338,*(uint8_t *)((long)local_2c8 + 0xf4),(uint8_t)local_2cc,bVar1,
                     side_two);
          PCMSegment::operator+=(&local_2b8,&PStack_338);
          if (PStack_338.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
            operator_delete(PStack_338.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl
                            .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                            (long)PStack_338.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>.
                                  _M_impl.super__Bvector_impl_data._M_end_of_storage -
                            (long)PStack_338.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>.
                                  _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base
                                  ._M_p);
            PStack_338.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            PStack_338.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
            PStack_338.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            PStack_338.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
            PStack_338.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
          }
          if (PStack_338.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
            operator_delete(PStack_338.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                            (long)PStack_338.data.super__Bvector_base<std::allocator<bool>_>._M_impl
                                  .super__Bvector_impl_data._M_end_of_storage -
                            (long)PStack_338.data.super__Bvector_base<std::allocator<bool>_>._M_impl
                                  .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
            PStack_338.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            PStack_338.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
            PStack_338.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            PStack_338.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
            PStack_338.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
          }
          Encodings::AppleGCR::six_and_two_sync(&PStack_338,7);
          PCMSegment::operator+=(&local_2b8,&PStack_338);
          if (PStack_338.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
            operator_delete(PStack_338.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl
                            .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                            (long)PStack_338.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>.
                                  _M_impl.super__Bvector_impl_data._M_end_of_storage -
                            (long)PStack_338.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>.
                                  _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base
                                  ._M_p);
            PStack_338.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            PStack_338.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
            PStack_338.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            PStack_338.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
            PStack_338.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
          }
          if (PStack_338.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
            operator_delete(PStack_338.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                            (long)PStack_338.data.super__Bvector_base<std::allocator<bool>_>._M_impl
                                  .super__Bvector_impl_data._M_end_of_storage -
                            (long)PStack_338.data.super__Bvector_base<std::allocator<bool>_>._M_impl
                                  .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
            PStack_338.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            PStack_338.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
            PStack_338.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            PStack_338.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
            PStack_338.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
          }
          Encodings::AppleGCR::Macintosh::data(&PStack_338,bVar1,(uint8_t *)local_248);
          PCMSegment::operator+=(&local_2b8,&PStack_338);
          if (PStack_338.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
            operator_delete(PStack_338.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl
                            .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                            (long)PStack_338.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>.
                                  _M_impl.super__Bvector_impl_data._M_end_of_storage -
                            (long)PStack_338.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>.
                                  _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base
                                  ._M_p);
            PStack_338.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            PStack_338.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
            PStack_338.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            PStack_338.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
            PStack_338.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
          }
          if (PStack_338.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
            operator_delete(PStack_338.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                            (long)PStack_338.data.super__Bvector_base<std::allocator<bool>_>._M_impl
                                  .super__Bvector_impl_data._M_end_of_storage -
                            (long)PStack_338.data.super__Bvector_base<std::allocator<bool>_>._M_impl
                                  .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
            PStack_338.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            PStack_338.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
            PStack_338.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            PStack_338.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
            PStack_338.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
          }
          Encodings::AppleGCR::six_and_two_sync(&PStack_338,0x14);
          PCMSegment::operator+=(&local_2b8,&PStack_338);
          if (PStack_338.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
            operator_delete(PStack_338.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl
                            .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                            (long)PStack_338.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>.
                                  _M_impl.super__Bvector_impl_data._M_end_of_storage -
                            (long)PStack_338.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>.
                                  _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base
                                  ._M_p);
            PStack_338.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            PStack_338.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
            PStack_338.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            PStack_338.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
            PStack_338.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
          }
          if (PStack_338.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
            operator_delete(PStack_338.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                            (long)PStack_338.data.super__Bvector_base<std::allocator<bool>_>._M_impl
                                  .super__Bvector_impl_data._M_end_of_storage -
                            (long)PStack_338.data.super__Bvector_base<std::allocator<bool>_>._M_impl
                                  .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
            PStack_338.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            PStack_338.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
            PStack_338.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            PStack_338.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
            PStack_338.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
          }
          uVar8 = uVar8 + 1;
        } while ((ulong)SVar4 >> 0x20 != uVar8);
      }
      local_248[0].length_of_a_bit.length = 0;
      local_248[0].length_of_a_bit.clock_rate = 0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Storage::Disk::PCMTrack,std::allocator<Storage::Disk::PCMTrack>,Storage::Disk::PCMSegment&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_248[0].data,
                 (PCMTrack **)local_248,(allocator<Storage::Disk::PCMTrack> *)&PStack_338,&local_2b8
                );
      p_Var2 = local_248[0].data.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      this = local_260;
      __mutex = local_2e0;
      (local_260->super_DiskImage)._vptr_DiskImage = (_func_int **)local_248[0].length_of_a_bit;
      (local_260->file_).file_ = (FILE *)0x0;
      local_248[0].data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      (local_260->file_).file_ = (FILE *)p_Var2;
      if (local_2b8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_2b8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_2b8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>.
                              _M_impl.super__Bvector_impl_data._M_end_of_storage -
                        (long)local_2b8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>.
                              _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                              _M_p);
        local_2b8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_2b8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
        local_2b8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_2b8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
        local_2b8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
      }
      if (local_2b8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
          ._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_2b8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_2b8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_2b8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_2b8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_2b8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
        local_2b8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_2b8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0;
        local_2b8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
      }
      goto LAB_0043b9db;
    }
  }
  (this->super_DiskImage)._vptr_DiskImage = (_func_int **)0x0;
  (this->file_).file_ = (FILE *)0x0;
LAB_0043b9db:
  pthread_mutex_unlock(__mutex);
  sVar9.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar9.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Storage::Disk::Track>)
         sVar9.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<::Storage::Disk::Track> MacintoshIMG::get_track_at_position(::Storage::Disk::Track::Address address) {
	/*
		The format_ byte has the following meanings:

		GCR:
			This byte appears on disk as the GCR format nibble in every sector tag.
			The low five bits are an interleave factor, either:

				'2' for 0 8 1 9 2 10 3 11 4 12 5 13 6 14 7 15; or
				'4' for 0 4 8 12 1 5 9 13 2 6 10 14 3 7 11 15.

			Bit 5 indicates double sided or not.

		MFM:
			The low five bits provide sector size as a multiple of 256 bytes.
			Bit 5 indicates double sided or not.
	*/

	std::lock_guard buffer_lock(buffer_mutex_);
	if(encoding_ == Encoding::GCR400 || encoding_ == Encoding::GCR800) {
		// Perform a GCR encoding.
		const auto included_sectors = Storage::Encodings::AppleGCR::Macintosh::sectors_in_track(address.position.as_int());
		const size_t start_sector = size_t(included_sectors.start * get_head_count() + included_sectors.length * address.head);

		if(start_sector*512 >= data_.size()) return nullptr;

		uint8_t *const sector = &data_[512 * start_sector];
		uint8_t *const tags = tags_.size() ? &tags_[12 * start_sector] : nullptr;

		Storage::Disk::PCMSegment segment;
		segment += Encodings::AppleGCR::six_and_two_sync(24);

		// Determine the sector ordering.
		uint8_t source_sectors[12] = {0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff};
		int destination = 0;
		for(int c = 0; c < included_sectors.length; ++c) {
			// Deal with collisions by finding the next non-colliding spot.
			while(source_sectors[destination] != 0xff) destination = (destination + 1) % included_sectors.length;
			source_sectors[destination] = uint8_t(c);
			destination = (destination + (format_ & 0x1f)) % included_sectors.length;
		}

		for(int c = 0; c < included_sectors.length; ++c) {
			const uint8_t sector_id = source_sectors[c];
			uint8_t sector_plus_tags[524];

			// Copy in the tags, if provided; otherwise generate them.
			if(tags) {
				memcpy(sector_plus_tags, &tags[sector_id * 12], 12);
			} else {
				// TODO: fill in tags properly.
				memset(sector_plus_tags, 0, 12);
			}

			// Copy in the sector body.
			memcpy(&sector_plus_tags[12], &sector[sector_id * 512], 512);

			// NB: sync lengths below are identical to those for
			// the Apple II, as I have no idea whatsoever what they
			// should be.

			segment += Encodings::AppleGCR::Macintosh::header(
				format_,
				uint8_t(address.position.as_int()),
				sector_id,
				!!address.head
			);
			segment += Encodings::AppleGCR::six_and_two_sync(7);
			segment += Encodings::AppleGCR::Macintosh::data(sector_id, sector_plus_tags);
			segment += Encodings::AppleGCR::six_and_two_sync(20);
		}

		// TODO: it seems some tracks are skewed respective to others; investigate further.

//		segment.rotate_right(3000);	// Just a test, yo.
		return std::make_shared<PCMTrack>(segment);
	}

	return nullptr;
}